

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86::forward(Convolution1D_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  _func_int *p_Var5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  _func_int *p_Var8;
  size_t sVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int *piVar16;
  long lVar17;
  undefined1 auVar18 [16];
  void *pvVar19;
  int iVar20;
  void *pvVar21;
  byte bVar22;
  uint _h;
  byte bVar23;
  int iVar24;
  float *pfVar25;
  uint _w;
  float *pfVar26;
  ulong uVar27;
  int iVar28;
  undefined1 (*pauVar29) [16];
  ulong uVar30;
  ulong uVar31;
  float *pfVar32;
  float *pfVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  ulong uVar37;
  bool bVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  v4sf one;
  float fVar42;
  float fVar43;
  float fVar56;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  ulong local_110;
  ulong local_108;
  Mat local_b8;
  undefined8 local_68;
  float fStack_60;
  float fStack_5c;
  long local_58;
  void *local_50;
  long local_48;
  void *local_40;
  ulong local_38;
  
  uVar31 = bottom_blob->elemsize;
  iVar3 = bottom_blob->elempack;
  p_Var5 = this->_vptr_Convolution1D_x86[-3];
  iVar4 = *(int *)(&this->field_0xd4 + (long)p_Var5);
  iVar35 = *(int *)(&this->field_0xd8 + (long)p_Var5);
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86 + (long)p_Var5),bottom_blob,
             &local_b8,opt);
  iVar20 = local_b8.h;
  iVar28 = -100;
  if ((local_b8.data != (void *)0x0) && ((long)local_b8.c * local_b8.cstep != 0)) {
    bVar22 = (*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) & 3) == 0 &
             opt->use_packing_layout;
    uVar37 = (ulong)(uint)local_b8.h;
    iVar28 = (uint)bVar22 + (uint)bVar22 * 2 + 1;
    iVar4 = (~((iVar4 + -1) * iVar35) + local_b8.w) /
            *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86[-3]);
    _w = iVar4 + 1;
    _h = (int)*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) / iVar28;
    Mat::create(top_blob,_w,_h,uVar31 / (ulong)(long)iVar3 << bVar22 * '\x02',iVar28,
                opt->blob_allocator);
    auVar18 = _DAT_00314010;
    iVar28 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      bVar23 = 0 < (int)_h & bVar22;
      if (iVar3 == 4 && bVar23 == 1) {
        pp_Var6 = this->_vptr_Convolution1D_x86;
        local_108 = 0;
        fVar39 = (float)DAT_00314010;
        fVar40 = DAT_00314010._4_4_;
        fVar41 = DAT_00314010._8_4_;
        fVar42 = DAT_00314010._12_4_;
        do {
          if (-1 < iVar4) {
            pauVar29 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_108 * top_blob->elemsize + (long)top_blob->data);
            pp_Var7 = this->_vptr_Convolution1D_x86;
            iVar28 = 0;
            iVar35 = 0;
            do {
              auVar49 = ZEXT816(0);
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar71 = ZEXT816(0);
              }
              else {
                auVar71 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var5) + local_108 * 0x10);
              }
              if (0 < iVar20) {
                pfVar33 = (float *)((this->weight_data_packed).cstep * local_108 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var8 = pp_Var7[-3];
                pfVar26 = (float *)((long)local_b8.data +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var8) * iVar28) * 4 +
                                   0xc);
                uVar31 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var8)) {
                    pfVar25 = pfVar26;
                    iVar24 = *(int *)(&this->field_0xd4 + (long)p_Var8);
                    do {
                      fVar43 = pfVar25[-3];
                      fVar61 = pfVar25[-2];
                      fVar56 = pfVar25[-1];
                      fVar63 = *pfVar25;
                      fVar66 = auVar71._4_4_;
                      fVar67 = auVar71._8_4_;
                      fVar68 = auVar71._12_4_;
                      auVar71._0_4_ =
                           pfVar33[0xc] * fVar63 +
                           pfVar33[8] * fVar56 + pfVar33[4] * fVar61 +
                           *pfVar33 * fVar43 + auVar71._0_4_;
                      auVar71._4_4_ =
                           pfVar33[0xd] * fVar63 +
                           pfVar33[9] * fVar56 + pfVar33[5] * fVar61 + pfVar33[1] * fVar43 + fVar66;
                      auVar71._8_4_ =
                           pfVar33[0xe] * fVar63 +
                           pfVar33[10] * fVar56 + pfVar33[6] * fVar61 + pfVar33[2] * fVar43 + fVar67
                      ;
                      auVar71._12_4_ =
                           pfVar33[0xf] * fVar63 +
                           pfVar33[0xb] * fVar56 + pfVar33[7] * fVar61 +
                           pfVar33[3] * fVar43 + fVar68;
                      pfVar33 = pfVar33 + 0x10;
                      pfVar25 = pfVar25 + (*(int *)(&this->field_0xd8 + (long)p_Var8) << 2);
                      iVar24 = iVar24 + -1;
                    } while (iVar24 != 0);
                  }
                  uVar31 = uVar31 + 1;
                  pfVar26 = (float *)((long)pfVar26 +
                                     (long)local_b8.w *
                                     CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize)
                                     );
                } while (uVar31 != uVar37);
              }
              fVar43 = auVar71._0_4_;
              fVar61 = auVar71._4_4_;
              fVar56 = auVar71._8_4_;
              fVar63 = auVar71._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar71 = maxps(auVar71,auVar49);
                break;
              case 2:
                auVar48 = maxps(auVar71,auVar49);
                auVar49 = minps(auVar71,auVar49);
                fVar43 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                auVar71._4_4_ = fVar43 * auVar49._4_4_ + auVar48._4_4_;
                auVar71._0_4_ = fVar43 * auVar49._0_4_ + auVar48._0_4_;
                auVar71._8_4_ = fVar43 * auVar49._8_4_ + auVar48._8_4_;
                auVar71._12_4_ = fVar43 * auVar49._12_4_ + auVar48._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar46._4_4_ = uVar1;
                auVar46._0_4_ = uVar1;
                auVar46._8_4_ = uVar1;
                auVar46._12_4_ = uVar1;
                auVar49 = maxps(auVar71,auVar46);
                auVar12._4_4_ = uVar2;
                auVar12._0_4_ = uVar2;
                auVar12._8_4_ = uVar2;
                auVar12._12_4_ = uVar2;
                auVar71 = minps(auVar49,auVar12);
                break;
              case 4:
                auVar57._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
                auVar57._8_4_ = -fVar56;
                auVar57._12_4_ = -fVar63;
                auVar49 = minps(auVar57,_DAT_00314020);
                auVar49 = maxps(auVar49,_DAT_00314030);
                fVar61 = auVar49._0_4_ * 1.442695 + 0.5;
                fVar63 = auVar49._4_4_ * 1.442695 + 0.5;
                fVar67 = auVar49._8_4_ * 1.442695 + 0.5;
                fVar69 = auVar49._12_4_ * 1.442695 + 0.5;
                fVar43 = (float)(int)fVar61;
                fVar56 = (float)(int)fVar63;
                fVar66 = (float)(int)fVar67;
                fVar68 = (float)(int)fVar69;
                fVar43 = fVar43 - (float)(-(uint)(fVar61 < fVar43) & (uint)fVar39);
                fVar56 = fVar56 - (float)(-(uint)(fVar63 < fVar56) & (uint)fVar40);
                fVar66 = fVar66 - (float)(-(uint)(fVar67 < fVar66) & (uint)fVar41);
                fVar68 = fVar68 - (float)(-(uint)(fVar69 < fVar68) & (uint)fVar42);
                fVar61 = fVar43 * -0.6931472 + auVar49._0_4_;
                fVar63 = fVar56 * -0.6931472 + auVar49._4_4_;
                fVar67 = fVar66 * -0.6931472 + auVar49._8_4_;
                fVar69 = fVar68 * -0.6931472 + auVar49._12_4_;
                auVar47._0_4_ =
                     fVar61 + fVar39 +
                     (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) * fVar61 +
                       0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5) * fVar61 * fVar61;
                auVar47._4_4_ =
                     fVar63 + fVar40 +
                     (((((fVar63 * 0.00019875691 + 0.0013981999) * fVar63 + 0.008333452) * fVar63 +
                       0.041665796) * fVar63 + 0.16666666) * fVar63 + 0.5) * fVar63 * fVar63;
                auVar47._8_4_ =
                     fVar67 + fVar41 +
                     (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
                       0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67;
                auVar47._12_4_ =
                     fVar69 + fVar42 +
                     (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) * fVar69 +
                       0.041665796) * fVar69 + 0.16666666) * fVar69 + 0.5) * fVar69 * fVar69;
                fVar67 = (float)((int)fVar43 * 0x800000 + (int)fVar39) * auVar47._0_4_ + fVar39;
                fVar69 = (float)((int)fVar56 * 0x800000 + (int)fVar40) * auVar47._4_4_ + fVar40;
                fVar66 = (float)((int)fVar66 * 0x800000 + (int)fVar41) * auVar47._8_4_ + fVar41;
                fVar68 = (float)((int)fVar68 * 0x800000 + (int)fVar42) * auVar47._12_4_ + fVar42;
                auVar11._4_4_ = fVar69;
                auVar11._0_4_ = fVar67;
                auVar11._8_4_ = fVar66;
                auVar11._12_4_ = fVar68;
                auVar49 = rcpps(auVar47,auVar11);
                fVar43 = auVar49._0_4_;
                fVar61 = auVar49._4_4_;
                fVar56 = auVar49._8_4_;
                fVar63 = auVar49._12_4_;
                auVar71._0_4_ = (fVar39 - fVar67 * fVar43) * fVar43 + fVar43;
                auVar71._4_4_ = (fVar40 - fVar69 * fVar61) * fVar61 + fVar61;
                auVar71._8_4_ = (fVar41 - fVar66 * fVar56) * fVar56 + fVar56;
                auVar71._12_4_ = (fVar42 - fVar68 * fVar63) * fVar63 + fVar63;
                break;
              case 5:
                auVar49 = minps(auVar71,_DAT_00314020);
                auVar49 = maxps(auVar49,_DAT_00314030);
                fVar66 = auVar49._0_4_ * 1.442695 + 0.5;
                fVar67 = auVar49._4_4_ * 1.442695 + 0.5;
                fVar68 = auVar49._8_4_ * 1.442695 + 0.5;
                fVar69 = auVar49._12_4_ * 1.442695 + 0.5;
                fVar60 = (float)(int)fVar66;
                fVar62 = (float)(int)fVar67;
                fVar64 = (float)(int)fVar68;
                fVar65 = (float)(int)fVar69;
                fVar60 = fVar60 - (float)(-(uint)(fVar66 < fVar60) & (uint)fVar39);
                fVar62 = fVar62 - (float)(-(uint)(fVar67 < fVar62) & (uint)fVar40);
                fVar64 = fVar64 - (float)(-(uint)(fVar68 < fVar64) & (uint)fVar41);
                fVar65 = fVar65 - (float)(-(uint)(fVar69 < fVar65) & (uint)fVar42);
                fVar66 = auVar49._0_4_ - fVar60 * 0.6931472;
                fVar67 = auVar49._4_4_ - fVar62 * 0.6931472;
                fVar68 = auVar49._8_4_ - fVar64 * 0.6931472;
                fVar69 = auVar49._12_4_ - fVar65 * 0.6931472;
                auVar70._0_4_ =
                     (float)((int)fVar60 * 0x800000 + (int)fVar39) *
                     (fVar66 + fVar39 +
                     (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                       0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * fVar66 * fVar66) +
                     fVar39;
                auVar70._4_4_ =
                     (float)((int)fVar62 * 0x800000 + (int)fVar40) *
                     (fVar67 + fVar40 +
                     (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
                       0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67) +
                     fVar40;
                auVar70._8_4_ =
                     (float)((int)fVar64 * 0x800000 + (int)fVar41) *
                     (fVar68 + fVar41 +
                     (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) * fVar68 +
                       0.041665796) * fVar68 + 0.16666666) * fVar68 + 0.5) * fVar68 * fVar68) +
                     fVar41;
                auVar70._12_4_ =
                     (float)((int)fVar65 * 0x800000 + (int)fVar42) *
                     (fVar69 + fVar42 +
                     (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) * fVar69 +
                       0.041665796) * fVar69 + 0.16666666) * fVar69 + 0.5) * fVar69 * fVar69) +
                     fVar42;
                auVar71 = maxps(auVar70,_DAT_003140c0);
                fVar66 = (float)(auVar71._0_4_ & 0x807fffff | 0x3f000000);
                fVar68 = (float)(auVar71._4_4_ & 0x807fffff | 0x3f000000);
                fVar60 = (float)(auVar71._8_4_ & 0x807fffff | 0x3f000000);
                fVar64 = (float)(auVar71._12_4_ & 0x807fffff | 0x3f000000);
                fVar67 = fVar66 + -1.0 + (float)(-(uint)(fVar66 < 0.70710677) & (uint)fVar66);
                fVar69 = fVar68 + -1.0 + (float)(-(uint)(fVar68 < 0.70710677) & (uint)fVar68);
                fVar62 = fVar60 + -1.0 + (float)(-(uint)(fVar60 < 0.70710677) & (uint)fVar60);
                fVar65 = fVar64 + -1.0 + (float)(-(uint)(fVar64 < 0.70710677) & (uint)fVar64);
                auVar44._0_8_ =
                     CONCAT44(-(uint)(auVar70._4_4_ <= 0.0),-(uint)(auVar70._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar44._8_4_ = -(uint)(auVar70._8_4_ <= 0.0) & 0x7fffffff;
                auVar44._12_4_ = -(uint)(auVar70._12_4_ <= 0.0) & 0x7fffffff;
                auVar49._4_4_ =
                     ~-(uint)(auVar70._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar71._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar68 < 0.70710677) & (uint)fVar40)) * 0.6931472 +
                             fVar69 + (((((((((fVar69 * 0.070376836 + -0.1151461) * fVar69 +
                                             0.116769984) * fVar69 + -0.12420141) * fVar69 +
                                           0.14249323) * fVar69 + -0.16668057) * fVar69 + 0.20000714
                                         ) * fVar69 + -0.24999994) * fVar69 + 0.3333333) * fVar69 +
                                      -0.5) * fVar69 * fVar69) * -2.0);
                auVar49._0_4_ =
                     ~-(uint)(auVar70._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar71._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar66 < 0.70710677) & (uint)fVar39)) * 0.6931472 +
                             fVar67 + (((((((((fVar67 * 0.070376836 + -0.1151461) * fVar67 +
                                             0.116769984) * fVar67 + -0.12420141) * fVar67 +
                                           0.14249323) * fVar67 + -0.16668057) * fVar67 + 0.20000714
                                         ) * fVar67 + -0.24999994) * fVar67 + 0.3333333) * fVar67 +
                                      -0.5) * fVar67 * fVar67) * -2.0);
                auVar49._8_4_ =
                     ~-(uint)(auVar70._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar71._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar60 < 0.70710677) & (uint)fVar41)) * 0.6931472 +
                             fVar62 + (((((((((fVar62 * 0.070376836 + -0.1151461) * fVar62 +
                                             0.116769984) * fVar62 + -0.12420141) * fVar62 +
                                           0.14249323) * fVar62 + -0.16668057) * fVar62 + 0.20000714
                                         ) * fVar62 + -0.24999994) * fVar62 + 0.3333333) * fVar62 +
                                      -0.5) * fVar62 * fVar62) * -2.0);
                auVar49._12_4_ =
                     ~-(uint)(auVar70._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar71._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar64 < 0.70710677) & (uint)fVar42)) * 0.6931472 +
                             fVar65 + (((((((((fVar65 * 0.070376836 + -0.1151461) * fVar65 +
                                             0.116769984) * fVar65 + -0.12420141) * fVar65 +
                                           0.14249323) * fVar65 + -0.16668057) * fVar65 + 0.20000714
                                         ) * fVar65 + -0.24999994) * fVar65 + 0.3333333) * fVar65 +
                                      -0.5) * fVar65 * fVar65) * -2.0);
                auVar49 = minps(auVar44 | auVar49,_DAT_00314020);
                auVar49 = maxps(auVar49,_DAT_00314030);
                fVar66 = auVar49._0_4_ * 1.442695 + 0.5;
                fVar67 = auVar49._4_4_ * 1.442695 + 0.5;
                fVar68 = auVar49._8_4_ * 1.442695 + 0.5;
                fVar69 = auVar49._12_4_ * 1.442695 + 0.5;
                fVar60 = (float)(int)fVar66;
                fVar62 = (float)(int)fVar67;
                fVar64 = (float)(int)fVar68;
                fVar65 = (float)(int)fVar69;
                fVar60 = fVar60 - (float)(-(uint)(fVar66 < fVar60) & (uint)fVar39);
                fVar62 = fVar62 - (float)(-(uint)(fVar67 < fVar62) & (uint)fVar40);
                fVar64 = fVar64 - (float)(-(uint)(fVar68 < fVar64) & (uint)fVar41);
                fVar65 = fVar65 - (float)(-(uint)(fVar69 < fVar65) & (uint)fVar42);
                fVar66 = auVar49._0_4_ - fVar60 * 0.6931472;
                fVar67 = auVar49._4_4_ - fVar62 * 0.6931472;
                fVar68 = auVar49._8_4_ - fVar64 * 0.6931472;
                fVar69 = auVar49._12_4_ - fVar65 * 0.6931472;
                auVar45._0_4_ =
                     fVar66 + fVar39 +
                     (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                       0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * fVar66 * fVar66;
                auVar45._4_4_ =
                     fVar67 + fVar40 +
                     (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
                       0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67;
                auVar45._8_4_ =
                     fVar68 + fVar41 +
                     (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) * fVar68 +
                       0.041665796) * fVar68 + 0.16666666) * fVar68 + 0.5) * fVar68 * fVar68;
                auVar45._12_4_ =
                     fVar69 + fVar42 +
                     (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) * fVar69 +
                       0.041665796) * fVar69 + 0.16666666) * fVar69 + 0.5) * fVar69 * fVar69;
                fVar60 = (float)((int)fVar60 * 0x800000 + (int)fVar39) * auVar45._0_4_ + fVar39;
                fVar62 = (float)((int)fVar62 * 0x800000 + (int)fVar40) * auVar45._4_4_ + fVar40;
                fVar64 = (float)((int)fVar64 * 0x800000 + (int)fVar41) * auVar45._8_4_ + fVar41;
                fVar65 = (float)((int)fVar65 * 0x800000 + (int)fVar42) * auVar45._12_4_ + fVar42;
                auVar54._4_4_ = fVar62;
                auVar54._0_4_ = fVar60;
                auVar54._8_4_ = fVar64;
                auVar54._12_4_ = fVar65;
                auVar49 = rcpps(auVar45,auVar54);
                fVar66 = auVar49._0_4_;
                fVar67 = auVar49._4_4_;
                fVar68 = auVar49._8_4_;
                fVar69 = auVar49._12_4_;
                auVar71._0_4_ =
                     fVar43 * (fVar66 + fVar66 + -1.0 + (2.0 - fVar60 * (fVar66 + fVar66)) * fVar66)
                ;
                auVar71._4_4_ =
                     fVar61 * (fVar67 + fVar67 + -1.0 + (2.0 - fVar62 * (fVar67 + fVar67)) * fVar67)
                ;
                auVar71._8_4_ =
                     fVar56 * (fVar68 + fVar68 + -1.0 + (2.0 - fVar64 * (fVar68 + fVar68)) * fVar68)
                ;
                auVar71._12_4_ =
                     fVar63 * (fVar69 + fVar69 + -1.0 + (2.0 - fVar65 * (fVar69 + fVar69)) * fVar69)
                ;
                break;
              case 6:
                fVar66 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar67 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar48._0_4_ = fVar66 * fVar43 + fVar67;
                auVar48._4_4_ = fVar66 * fVar61 + fVar67;
                auVar48._8_4_ = fVar66 * fVar56 + fVar67;
                auVar48._12_4_ = fVar66 * fVar63 + fVar67;
                auVar49 = maxps(auVar48,auVar49);
                auVar49 = minps(auVar49,auVar18);
                auVar71._0_4_ = fVar43 * auVar49._0_4_;
                auVar71._4_4_ = fVar61 * auVar49._4_4_;
                auVar71._8_4_ = fVar56 * auVar49._8_4_;
                auVar71._12_4_ = fVar63 * auVar49._12_4_;
              }
              *pauVar29 = auVar71;
              pauVar29 = pauVar29 + 1;
              iVar28 = iVar28 + 4;
              bVar38 = iVar35 != iVar4;
              iVar35 = iVar35 + 1;
            } while (bVar38);
          }
          local_108 = local_108 + 1;
        } while (local_108 != _h);
      }
      auVar71 = _DAT_00314030;
      auVar49 = _DAT_00314020;
      auVar18 = _DAT_00314010;
      if (bVar23 == 1 && iVar3 == 1) {
        pp_Var6 = this->_vptr_Convolution1D_x86;
        uVar31 = 0;
        fVar39 = (float)DAT_00314010;
        fVar40 = DAT_00314010._4_4_;
        fVar41 = DAT_00314010._8_4_;
        fVar42 = DAT_00314010._12_4_;
        do {
          if (-1 < iVar4) {
            pauVar29 = (undefined1 (*) [16])
                       ((long)top_blob->w * uVar31 * top_blob->elemsize + (long)top_blob->data);
            pp_Var7 = this->_vptr_Convolution1D_x86;
            iVar35 = 0;
            do {
              auVar48 = ZEXT816(0);
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar58 = ZEXT816(0);
              }
              else {
                auVar58 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var5) + uVar31 * 0x10);
              }
              if (0 < iVar20) {
                pfVar33 = (float *)((this->weight_data_packed).cstep * uVar31 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var8 = pp_Var7[-3];
                pfVar26 = (float *)((long)(*(int *)(&this->field_0xdc + (long)p_Var8) * iVar35) * 4
                                   + (long)local_b8.data);
                uVar30 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var8)) {
                    pfVar25 = pfVar26;
                    auVar54 = auVar58;
                    iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var8);
                    do {
                      fVar43 = *pfVar25;
                      auVar58._0_4_ = auVar54._0_4_ + *pfVar33 * fVar43;
                      auVar58._4_4_ = auVar54._4_4_ + pfVar33[1] * fVar43;
                      auVar58._8_4_ = auVar54._8_4_ + pfVar33[2] * fVar43;
                      auVar58._12_4_ = auVar54._12_4_ + pfVar33[3] * fVar43;
                      pfVar33 = pfVar33 + 4;
                      pfVar25 = pfVar25 + *(int *)(&this->field_0xd8 + (long)p_Var8);
                      iVar28 = iVar28 + -1;
                      auVar54 = auVar58;
                    } while (iVar28 != 0);
                  }
                  uVar30 = uVar30 + 1;
                  pfVar26 = (float *)((long)pfVar26 +
                                     (long)local_b8.w *
                                     CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize)
                                     );
                } while (uVar30 != uVar37);
              }
              fVar43 = auVar58._0_4_;
              fVar61 = auVar58._4_4_;
              fVar56 = auVar58._8_4_;
              fVar63 = auVar58._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar58 = maxps(auVar58,auVar48);
                break;
              case 2:
                auVar54 = maxps(auVar58,auVar48);
                auVar48 = minps(auVar58,auVar48);
                fVar43 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                auVar58._4_4_ = fVar43 * auVar48._4_4_ + auVar54._4_4_;
                auVar58._0_4_ = fVar43 * auVar48._0_4_ + auVar54._0_4_;
                auVar58._8_4_ = fVar43 * auVar48._8_4_ + auVar54._8_4_;
                auVar58._12_4_ = fVar43 * auVar48._12_4_ + auVar54._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar52._4_4_ = uVar1;
                auVar52._0_4_ = uVar1;
                auVar52._8_4_ = uVar1;
                auVar52._12_4_ = uVar1;
                auVar48 = maxps(auVar58,auVar52);
                auVar14._4_4_ = uVar2;
                auVar14._0_4_ = uVar2;
                auVar14._8_4_ = uVar2;
                auVar14._12_4_ = uVar2;
                auVar58 = minps(auVar48,auVar14);
                break;
              case 4:
                auVar59._0_8_ = auVar58._0_8_ ^ 0x8000000080000000;
                auVar59._8_4_ = -fVar56;
                auVar59._12_4_ = -fVar63;
                auVar48 = minps(auVar59,auVar49);
                auVar48 = maxps(auVar48,auVar71);
                fVar61 = auVar48._0_4_ * 1.442695 + 0.5;
                fVar63 = auVar48._4_4_ * 1.442695 + 0.5;
                fVar67 = auVar48._8_4_ * 1.442695 + 0.5;
                fVar69 = auVar48._12_4_ * 1.442695 + 0.5;
                fVar43 = (float)(int)fVar61;
                fVar56 = (float)(int)fVar63;
                fVar66 = (float)(int)fVar67;
                fVar68 = (float)(int)fVar69;
                fVar43 = fVar43 - (float)(-(uint)(fVar61 < fVar43) & (uint)fVar39);
                fVar56 = fVar56 - (float)(-(uint)(fVar63 < fVar56) & (uint)fVar40);
                fVar66 = fVar66 - (float)(-(uint)(fVar67 < fVar66) & (uint)fVar41);
                fVar68 = fVar68 - (float)(-(uint)(fVar69 < fVar68) & (uint)fVar42);
                fVar61 = fVar43 * -0.6931472 + auVar48._0_4_;
                fVar63 = fVar56 * -0.6931472 + auVar48._4_4_;
                fVar67 = fVar66 * -0.6931472 + auVar48._8_4_;
                fVar69 = fVar68 * -0.6931472 + auVar48._12_4_;
                auVar53._0_4_ =
                     fVar61 + fVar39 +
                     (((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) * fVar61 +
                       0.041665796) * fVar61 + 0.16666666) * fVar61 + 0.5) * fVar61 * fVar61;
                auVar53._4_4_ =
                     fVar63 + fVar40 +
                     (((((fVar63 * 0.00019875691 + 0.0013981999) * fVar63 + 0.008333452) * fVar63 +
                       0.041665796) * fVar63 + 0.16666666) * fVar63 + 0.5) * fVar63 * fVar63;
                auVar53._8_4_ =
                     fVar67 + fVar41 +
                     (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
                       0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67;
                auVar53._12_4_ =
                     fVar69 + fVar42 +
                     (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) * fVar69 +
                       0.041665796) * fVar69 + 0.16666666) * fVar69 + 0.5) * fVar69 * fVar69;
                fVar67 = (float)((int)fVar43 * 0x800000 + (int)fVar39) * auVar53._0_4_ + fVar39;
                fVar69 = (float)((int)fVar56 * 0x800000 + (int)fVar40) * auVar53._4_4_ + fVar40;
                fVar66 = (float)((int)fVar66 * 0x800000 + (int)fVar41) * auVar53._8_4_ + fVar41;
                fVar68 = (float)((int)fVar68 * 0x800000 + (int)fVar42) * auVar53._12_4_ + fVar42;
                auVar13._4_4_ = fVar69;
                auVar13._0_4_ = fVar67;
                auVar13._8_4_ = fVar66;
                auVar13._12_4_ = fVar68;
                auVar48 = rcpps(auVar53,auVar13);
                fVar43 = auVar48._0_4_;
                fVar61 = auVar48._4_4_;
                fVar56 = auVar48._8_4_;
                fVar63 = auVar48._12_4_;
                auVar58._0_4_ = (fVar39 - fVar67 * fVar43) * fVar43 + fVar43;
                auVar58._4_4_ = (fVar40 - fVar69 * fVar61) * fVar61 + fVar61;
                auVar58._8_4_ = (fVar41 - fVar66 * fVar56) * fVar56 + fVar56;
                auVar58._12_4_ = (fVar42 - fVar68 * fVar63) * fVar63 + fVar63;
                break;
              case 5:
                auVar48 = minps(auVar58,auVar49);
                auVar48 = maxps(auVar48,auVar71);
                fVar66 = auVar48._0_4_ * 1.442695 + 0.5;
                fVar67 = auVar48._4_4_ * 1.442695 + 0.5;
                fVar68 = auVar48._8_4_ * 1.442695 + 0.5;
                fVar69 = auVar48._12_4_ * 1.442695 + 0.5;
                fVar60 = (float)(int)fVar66;
                fVar62 = (float)(int)fVar67;
                fVar64 = (float)(int)fVar68;
                fVar65 = (float)(int)fVar69;
                fVar60 = fVar60 - (float)(-(uint)(fVar66 < fVar60) & (uint)fVar39);
                fVar62 = fVar62 - (float)(-(uint)(fVar67 < fVar62) & (uint)fVar40);
                fVar64 = fVar64 - (float)(-(uint)(fVar68 < fVar64) & (uint)fVar41);
                fVar65 = fVar65 - (float)(-(uint)(fVar69 < fVar65) & (uint)fVar42);
                fVar66 = auVar48._0_4_ - fVar60 * 0.6931472;
                fVar67 = auVar48._4_4_ - fVar62 * 0.6931472;
                fVar68 = auVar48._8_4_ - fVar64 * 0.6931472;
                fVar69 = auVar48._12_4_ - fVar65 * 0.6931472;
                auVar72._0_4_ =
                     (float)((int)fVar60 * 0x800000 + (int)fVar39) *
                     (fVar66 + fVar39 +
                     (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                       0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * fVar66 * fVar66) +
                     fVar39;
                auVar72._4_4_ =
                     (float)((int)fVar62 * 0x800000 + (int)fVar40) *
                     (fVar67 + fVar40 +
                     (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
                       0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67) +
                     fVar40;
                auVar72._8_4_ =
                     (float)((int)fVar64 * 0x800000 + (int)fVar41) *
                     (fVar68 + fVar41 +
                     (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) * fVar68 +
                       0.041665796) * fVar68 + 0.16666666) * fVar68 + 0.5) * fVar68 * fVar68) +
                     fVar41;
                auVar72._12_4_ =
                     (float)((int)fVar65 * 0x800000 + (int)fVar42) *
                     (fVar69 + fVar42 +
                     (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) * fVar69 +
                       0.041665796) * fVar69 + 0.16666666) * fVar69 + 0.5) * fVar69 * fVar69) +
                     fVar42;
                auVar48 = maxps(auVar72,_DAT_003140c0);
                fVar66 = (float)(auVar48._0_4_ & 0x807fffff | 0x3f000000);
                fVar68 = (float)(auVar48._4_4_ & 0x807fffff | 0x3f000000);
                fVar60 = (float)(auVar48._8_4_ & 0x807fffff | 0x3f000000);
                fVar64 = (float)(auVar48._12_4_ & 0x807fffff | 0x3f000000);
                fVar67 = fVar66 + -1.0 + (float)(-(uint)(fVar66 < 0.70710677) & (uint)fVar66);
                fVar69 = fVar68 + -1.0 + (float)(-(uint)(fVar68 < 0.70710677) & (uint)fVar68);
                fVar62 = fVar60 + -1.0 + (float)(-(uint)(fVar60 < 0.70710677) & (uint)fVar60);
                fVar65 = fVar64 + -1.0 + (float)(-(uint)(fVar64 < 0.70710677) & (uint)fVar64);
                auVar50._0_8_ =
                     CONCAT44(-(uint)(auVar72._4_4_ <= 0.0),-(uint)(auVar72._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar50._8_4_ = -(uint)(auVar72._8_4_ <= 0.0) & 0x7fffffff;
                auVar50._12_4_ = -(uint)(auVar72._12_4_ <= 0.0) & 0x7fffffff;
                auVar10._4_4_ =
                     ~-(uint)(auVar72._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar48._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar68 < 0.70710677) & (uint)fVar40)) * 0.6931472 +
                             fVar69 + (((((((((fVar69 * 0.070376836 + -0.1151461) * fVar69 +
                                             0.116769984) * fVar69 + -0.12420141) * fVar69 +
                                           0.14249323) * fVar69 + -0.16668057) * fVar69 + 0.20000714
                                         ) * fVar69 + -0.24999994) * fVar69 + 0.3333333) * fVar69 +
                                      -0.5) * fVar69 * fVar69) * -2.0);
                auVar10._0_4_ =
                     ~-(uint)(auVar72._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar48._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar66 < 0.70710677) & (uint)fVar39)) * 0.6931472 +
                             fVar67 + (((((((((fVar67 * 0.070376836 + -0.1151461) * fVar67 +
                                             0.116769984) * fVar67 + -0.12420141) * fVar67 +
                                           0.14249323) * fVar67 + -0.16668057) * fVar67 + 0.20000714
                                         ) * fVar67 + -0.24999994) * fVar67 + 0.3333333) * fVar67 +
                                      -0.5) * fVar67 * fVar67) * -2.0);
                auVar10._8_4_ =
                     ~-(uint)(auVar72._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar48._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar60 < 0.70710677) & (uint)fVar41)) * 0.6931472 +
                             fVar62 + (((((((((fVar62 * 0.070376836 + -0.1151461) * fVar62 +
                                             0.116769984) * fVar62 + -0.12420141) * fVar62 +
                                           0.14249323) * fVar62 + -0.16668057) * fVar62 + 0.20000714
                                         ) * fVar62 + -0.24999994) * fVar62 + 0.3333333) * fVar62 +
                                      -0.5) * fVar62 * fVar62) * -2.0);
                auVar10._12_4_ =
                     ~-(uint)(auVar72._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar48._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar64 < 0.70710677) & (uint)fVar42)) * 0.6931472 +
                             fVar65 + (((((((((fVar65 * 0.070376836 + -0.1151461) * fVar65 +
                                             0.116769984) * fVar65 + -0.12420141) * fVar65 +
                                           0.14249323) * fVar65 + -0.16668057) * fVar65 + 0.20000714
                                         ) * fVar65 + -0.24999994) * fVar65 + 0.3333333) * fVar65 +
                                      -0.5) * fVar65 * fVar65) * -2.0);
                auVar48 = minps(auVar50 | auVar10,auVar49);
                auVar48 = maxps(auVar48,auVar71);
                fVar66 = auVar48._0_4_ * 1.442695 + 0.5;
                fVar67 = auVar48._4_4_ * 1.442695 + 0.5;
                fVar68 = auVar48._8_4_ * 1.442695 + 0.5;
                fVar69 = auVar48._12_4_ * 1.442695 + 0.5;
                fVar60 = (float)(int)fVar66;
                fVar62 = (float)(int)fVar67;
                fVar64 = (float)(int)fVar68;
                fVar65 = (float)(int)fVar69;
                fVar60 = fVar60 - (float)(-(uint)(fVar66 < fVar60) & (uint)fVar39);
                fVar62 = fVar62 - (float)(-(uint)(fVar67 < fVar62) & (uint)fVar40);
                fVar64 = fVar64 - (float)(-(uint)(fVar68 < fVar64) & (uint)fVar41);
                fVar65 = fVar65 - (float)(-(uint)(fVar69 < fVar65) & (uint)fVar42);
                fVar66 = auVar48._0_4_ - fVar60 * 0.6931472;
                fVar67 = auVar48._4_4_ - fVar62 * 0.6931472;
                fVar68 = auVar48._8_4_ - fVar64 * 0.6931472;
                fVar69 = auVar48._12_4_ - fVar65 * 0.6931472;
                auVar51._0_4_ =
                     fVar66 + fVar39 +
                     (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                       0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * fVar66 * fVar66;
                auVar51._4_4_ =
                     fVar67 + fVar40 +
                     (((((fVar67 * 0.00019875691 + 0.0013981999) * fVar67 + 0.008333452) * fVar67 +
                       0.041665796) * fVar67 + 0.16666666) * fVar67 + 0.5) * fVar67 * fVar67;
                auVar51._8_4_ =
                     fVar68 + fVar41 +
                     (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) * fVar68 +
                       0.041665796) * fVar68 + 0.16666666) * fVar68 + 0.5) * fVar68 * fVar68;
                auVar51._12_4_ =
                     fVar69 + fVar42 +
                     (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) * fVar69 +
                       0.041665796) * fVar69 + 0.16666666) * fVar69 + 0.5) * fVar69 * fVar69;
                fVar60 = (float)((int)fVar60 * 0x800000 + (int)fVar39) * auVar51._0_4_ + fVar39;
                fVar62 = (float)((int)fVar62 * 0x800000 + (int)fVar40) * auVar51._4_4_ + fVar40;
                fVar64 = (float)((int)fVar64 * 0x800000 + (int)fVar41) * auVar51._8_4_ + fVar41;
                fVar65 = (float)((int)fVar65 * 0x800000 + (int)fVar42) * auVar51._12_4_ + fVar42;
                auVar15._4_4_ = fVar62;
                auVar15._0_4_ = fVar60;
                auVar15._8_4_ = fVar64;
                auVar15._12_4_ = fVar65;
                auVar48 = rcpps(auVar51,auVar15);
                fVar66 = auVar48._0_4_;
                fVar67 = auVar48._4_4_;
                fVar68 = auVar48._8_4_;
                fVar69 = auVar48._12_4_;
                auVar58._0_4_ =
                     fVar43 * (fVar66 + fVar66 + -1.0 + (2.0 - fVar60 * (fVar66 + fVar66)) * fVar66)
                ;
                auVar58._4_4_ =
                     fVar61 * (fVar67 + fVar67 + -1.0 + (2.0 - fVar62 * (fVar67 + fVar67)) * fVar67)
                ;
                auVar58._8_4_ =
                     fVar56 * (fVar68 + fVar68 + -1.0 + (2.0 - fVar64 * (fVar68 + fVar68)) * fVar68)
                ;
                auVar58._12_4_ =
                     fVar63 * (fVar69 + fVar69 + -1.0 + (2.0 - fVar65 * (fVar69 + fVar69)) * fVar69)
                ;
                break;
              case 6:
                fVar66 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar67 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar55._0_4_ = fVar66 * fVar43 + fVar67;
                auVar55._4_4_ = fVar66 * fVar61 + fVar67;
                auVar55._8_4_ = fVar66 * fVar56 + fVar67;
                auVar55._12_4_ = fVar66 * fVar63 + fVar67;
                auVar48 = maxps(auVar55,auVar48);
                auVar48 = minps(auVar48,auVar18);
                auVar58._0_4_ = fVar43 * auVar48._0_4_;
                auVar58._4_4_ = fVar61 * auVar48._4_4_;
                auVar58._8_4_ = fVar56 * auVar48._8_4_;
                auVar58._12_4_ = fVar63 * auVar48._12_4_;
              }
              *pauVar29 = auVar58;
              pauVar29 = pauVar29 + 1;
              bVar38 = iVar35 != iVar4;
              iVar35 = iVar35 + 1;
            } while (bVar38);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != _h);
      }
      bVar22 = (bVar22 ^ 1) & 0 < (int)_h ^ 1;
      if (iVar3 == 4 && bVar22 == 0) {
        local_40 = top_blob->data;
        local_48 = (long)top_blob->w * top_blob->elemsize;
        pp_Var6 = this->_vptr_Convolution1D_x86;
        local_50 = (this->weight_data_packed).data;
        local_58 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
        local_38 = (ulong)_h;
        local_110 = 0;
        do {
          pvVar21 = local_40;
          pvVar19 = local_b8.data;
          if (-1 < iVar4) {
            lVar36 = local_48 * local_110;
            pfVar26 = (float *)(local_58 * local_110 + (long)local_50);
            lVar34 = (long)local_b8.w;
            lVar17 = CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
            pp_Var7 = this->_vptr_Convolution1D_x86;
            iVar35 = 0;
            uVar31 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                fVar39 = 0.0;
              }
              else {
                fVar39 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var5) + local_110 * 4);
              }
              fVar40 = 0.0;
              fVar42 = 0.0;
              fVar41 = 0.0;
              if (iVar20 < 1) {
                fVar42 = 0.0;
                fVar40 = 0.0;
                fVar41 = 0.0;
              }
              else {
                p_Var8 = pp_Var7[-3];
                pfVar33 = (float *)((long)pvVar19 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var8) * iVar35) * 4);
                uVar30 = 0;
                pfVar25 = pfVar26;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var8)) {
                    pfVar32 = pfVar33;
                    iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var8);
                    do {
                      fVar42 = pfVar25[3] * pfVar32[3] + pfVar25[1] * pfVar32[1];
                      fVar39 = fVar42 + fVar39 + pfVar25[2] * pfVar32[2] + *pfVar25 * *pfVar32;
                      pfVar25 = pfVar25 + 4;
                      pfVar32 = pfVar32 + (*(int *)(&this->field_0xd8 + (long)p_Var8) << 2);
                      iVar28 = iVar28 + -1;
                      fVar40 = fVar42;
                      fVar41 = fVar42;
                    } while (iVar28 != 0);
                  }
                  uVar30 = uVar30 + 1;
                  pfVar33 = (float *)((long)pfVar33 + lVar34 * lVar17);
                } while (uVar30 != uVar37);
              }
              fVar43 = fVar39;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                if (fVar39 <= 0.0) {
                  fVar43 = 0.0;
                }
                break;
              case 2:
                fVar43 = (float)(-(uint)(0.0 < fVar39) & 0x3f800000 |
                                ~-(uint)(0.0 < fVar39) &
                                **(uint **)(&this->field_0xf8 + (long)p_Var5)) * fVar39;
                break;
              case 3:
                fVar40 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                if (fVar39 <= fVar40) {
                  fVar39 = fVar40;
                }
                fVar40 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                fVar43 = fVar39;
                if (fVar40 <= fVar39) {
                  fVar43 = fVar40;
                }
                break;
              case 4:
                fVar39 = expf(-fVar39);
                fVar43 = 1.0 / (fVar39 + 1.0);
                break;
              case 5:
                local_68 = (void *)CONCAT44(fVar42,fVar39);
                fStack_60 = fVar40;
                fStack_5c = fVar41;
                fVar39 = expf(fVar39);
                fVar39 = logf(fVar39 + 1.0);
                fVar39 = tanhf(fVar39);
                fVar43 = fVar39 * (float)local_68;
                break;
              case 6:
                fVar40 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar41 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                fVar42 = -fVar41 / fVar40;
                fVar43 = 0.0;
                if ((fVar42 <= fVar39) && (fVar43 = fVar39, fVar39 <= fVar42 + 1.0 / fVar40)) {
                  fVar43 = (fVar40 * fVar39 + fVar41) * fVar39;
                }
              }
              *(float *)((long)pvVar21 + uVar31 * 4 + lVar36) = fVar43;
              uVar31 = uVar31 + 1;
              iVar35 = iVar35 + 4;
            } while (uVar31 != _w);
          }
          local_110 = local_110 + 1;
        } while (local_110 != local_38);
      }
      if (bVar22 == 0 && iVar3 == 1) {
        local_68 = top_blob->data;
        iVar3 = top_blob->w;
        sVar9 = top_blob->elemsize;
        pp_Var6 = this->_vptr_Convolution1D_x86;
        uVar31 = 0;
        do {
          pvVar21 = local_68;
          pvVar19 = local_b8.data;
          if (-1 < iVar4) {
            lVar34 = (long)local_b8.w;
            lVar17 = CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
            uVar30 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                fVar39 = 0.0;
              }
              else {
                fVar39 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var5) + uVar31 * 4);
              }
              if (0 < iVar20) {
                iVar35 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                pfVar33 = (float *)((long)((int)uVar31 * iVar20 * iVar35) * 4 +
                                   *(long *)(&this->field_0x148 + (long)p_Var5));
                pfVar26 = (float *)((long)pvVar19 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * (int)uVar30)
                                   * 4);
                uVar27 = 0;
                do {
                  if (0 < iVar35) {
                    pfVar25 = pfVar26;
                    iVar28 = iVar35;
                    do {
                      fVar39 = fVar39 + *pfVar33 * *pfVar25;
                      pfVar33 = pfVar33 + 1;
                      pfVar25 = pfVar25 + *(int *)(&this->field_0xd8 + (long)p_Var5);
                      iVar28 = iVar28 + -1;
                    } while (iVar28 != 0);
                  }
                  uVar27 = uVar27 + 1;
                  pfVar26 = (float *)((long)pfVar26 + lVar34 * lVar17);
                } while (uVar27 != uVar37);
              }
              fVar40 = fVar39;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                if (fVar39 <= 0.0) {
                  fVar40 = 0.0;
                }
                break;
              case 2:
                fVar40 = (float)(-(uint)(0.0 < fVar39) & 0x3f800000 |
                                ~-(uint)(0.0 < fVar39) &
                                **(uint **)(&this->field_0xf8 + (long)p_Var5)) * fVar39;
                break;
              case 3:
                fVar40 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                if (fVar39 <= fVar40) {
                  fVar39 = fVar40;
                }
                fVar41 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                fVar40 = fVar39;
                if (fVar41 <= fVar39) {
                  fVar40 = fVar41;
                }
                break;
              case 4:
                fVar39 = expf(-fVar39);
                fVar40 = 1.0 / (fVar39 + 1.0);
                break;
              case 5:
                fVar40 = expf(fVar39);
                fVar40 = logf(fVar40 + 1.0);
                fVar40 = tanhf(fVar40);
                fVar40 = fVar40 * fVar39;
                break;
              case 6:
                fVar41 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar42 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                fVar43 = -fVar42 / fVar41;
                fVar40 = 0.0;
                if ((fVar43 <= fVar39) && (fVar40 = fVar39, fVar39 <= fVar43 + 1.0 / fVar41)) {
                  fVar40 = (fVar41 * fVar39 + fVar42) * fVar39;
                }
              }
              *(float *)((long)pvVar21 + uVar30 * 4 + (long)iVar3 * sVar9 * uVar31) = fVar40;
              uVar30 = uVar30 + 1;
            } while (uVar30 != _w);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != _h);
      }
      iVar28 = 0;
    }
  }
  piVar16 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar28;
}

Assistant:

int Convolution1D_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}